

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O0

int input_huffman(uchar *infile)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uchar *in_RDI;
  int c;
  int local_4;
  
  iVar1 = input_nbits(in_RDI,3);
  if (iVar1 < 4) {
    return 1 << ((byte)iVar1 & 0x1f);
  }
  uVar2 = input_bit(in_RDI);
  uVar2 = uVar2 | iVar1 << 1;
  if ((int)uVar2 < 0xd) {
    switch(uVar2) {
    case 8:
      return 3;
    case 9:
      return 5;
    case 10:
      return 10;
    case 0xb:
      return 0xc;
    case 0xc:
      return 0xf;
    }
  }
  uVar3 = input_bit(in_RDI);
  uVar3 = uVar3 | uVar2 << 1;
  if ((int)uVar3 < 0x1f) {
    switch(uVar3) {
    case 0x1a:
      local_4 = 6;
      break;
    case 0x1b:
      local_4 = 7;
      break;
    case 0x1c:
      local_4 = 9;
      break;
    case 0x1d:
      local_4 = 0xb;
      break;
    case 0x1e:
      local_4 = 0xd;
      break;
    default:
      goto switchD_00269830_default;
    }
  }
  else {
switchD_00269830_default:
    uVar2 = input_bit(in_RDI);
    if ((uVar2 | uVar3 << 1) == 0x3e) {
      local_4 = 0;
    }
    else {
      local_4 = 0xe;
    }
  }
  return local_4;
}

Assistant:

static int input_huffman(unsigned char *infile)
{
int c;

	/*
	 * get first 3 bits to start
	 */
	c = input_nbits(infile,3);
	if (c < 4) {
		/*
		 * this is all we need
		 * return 1,2,4,8 for c=0,1,2,3
		 */
		return(1<<c);
	}
	/*
	 * get the next bit
	 */
	c = input_bit(infile) | (c<<1);
	if (c < 13) {
		/*
		 * OK, 4 bits is enough
		 */
		switch (c) {
			case  8 : return(3);
			case  9 : return(5);
			case 10 : return(10);
			case 11 : return(12);
			case 12 : return(15);
		}
	}
	/*
	 * get yet another bit
	 */
	c = input_bit(infile) | (c<<1);
	if (c < 31) {
		/*
		 * OK, 5 bits is enough
		 */
		switch (c) {
			case 26 : return(6);
			case 27 : return(7);
			case 28 : return(9);
			case 29 : return(11);
			case 30 : return(13);
		}
	}
	/*
	 * need the 6th bit
	 */
	c = input_bit(infile) | (c<<1);
	if (c == 62) {
		return(0);
	} else {
		return(14);
	}
}